

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateModuleTypeInformation(ExpressionTranslateContext *ctx)

{
  TypeBase *pTVar1;
  uint uVar2;
  TypeBase **ppTVar3;
  TypeArray *pTVar4;
  TypeUnsizedArray *pTVar5;
  TypeRef *pTVar6;
  TypeFunction *pTVar7;
  TypeClass *pTVar8;
  TypeStruct *pTVar9;
  char *pcVar10;
  bool bVar11;
  uint local_cc;
  MemberHandle *local_b8;
  MemberHandle *curr_4;
  MemberHandle *curr_3;
  uint count_2;
  TypeStruct *typeStruct_1;
  TypeHandle *curr_2;
  TypeFunction *typeFunction_1;
  TypeBase *type_1;
  MemberHandle *pMStack_78;
  uint i_1;
  MemberHandle *curr_1;
  uint count_1;
  TypeStruct *typeStruct;
  MemberHandle *pMStack_58;
  bool hasFlags;
  MemberHandle *curr;
  uint count;
  TypeClass *typeClass;
  TypeFunction *typeFunction;
  TypeRef *typeRef;
  TypeUnsizedArray *typeUnsizedArray;
  TypeArray *typeArray;
  TypeBase *type;
  uint i;
  ExpressionTranslateContext *ctx_local;
  
  PrintIndentedLine(ctx,"// Register types");
  for (type._4_4_ = 0; uVar2 = SmallArray<TypeBase_*,_128U>::size(&ctx->ctx->types),
      type._4_4_ < uVar2; type._4_4_ = type._4_4_ + 1) {
    ppTVar3 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->ctx->types,type._4_4_);
    pTVar1 = *ppTVar3;
    if ((pTVar1->isGeneric & 1U) == 0) {
      PrintIndent(ctx);
      Print(ctx,"__nullcTR[%d] = __nullcRegisterType(",(ulong)type._4_4_);
      Print(ctx,"%uu, ",(ulong)pTVar1->nameHash);
      Print(ctx,"\"%.*s\", ",(ulong)(uint)((int)(pTVar1->name).end - (int)(pTVar1->name).begin),
            (pTVar1->name).begin);
      Print(ctx,"%lld, ",pTVar1->size);
      pTVar4 = getType<TypeArray>(pTVar1);
      if (pTVar4 == (TypeArray *)0x0) {
        pTVar5 = getType<TypeUnsizedArray>(pTVar1);
        if (pTVar5 == (TypeUnsizedArray *)0x0) {
          pTVar6 = getType<TypeRef>(pTVar1);
          if (pTVar6 == (TypeRef *)0x0) {
            pTVar7 = getType<TypeFunction>(pTVar1);
            if (pTVar7 == (TypeFunction *)0x0) {
              pTVar8 = getType<TypeClass>(pTVar1);
              if (pTVar8 == (TypeClass *)0x0) {
                pTVar9 = getType<TypeStruct>(pTVar1);
                if (pTVar9 == (TypeStruct *)0x0) {
                  Print(ctx,"__nullcTR[0], ");
                  Print(ctx,"0, NULLC_NONE, %d, 0);",(ulong)pTVar1->alignment);
                }
                else {
                  curr_1._4_4_ = 0;
                  for (pMStack_78 = (pTVar9->members).head; pMStack_78 != (MemberHandle *)0x0;
                      pMStack_78 = pMStack_78->next) {
                    if (*(pMStack_78->variable->name->name).begin != '$') {
                      curr_1._4_4_ = curr_1._4_4_ + 1;
                    }
                  }
                  Print(ctx,"__nullcTR[0], ");
                  Print(ctx,"%d, NULLC_CLASS, %d, 0);",(ulong)curr_1._4_4_,
                        (ulong)(pTVar9->super_TypeBase).alignment);
                }
              }
              else {
                curr._4_4_ = 0;
                for (pMStack_58 = (pTVar8->super_TypeStruct).members.head;
                    pMStack_58 != (MemberHandle *)0x0; pMStack_58 = pMStack_58->next) {
                  if (*(pMStack_58->variable->name->name).begin != '$') {
                    curr._4_4_ = curr._4_4_ + 1;
                  }
                }
                if (pTVar8->baseClass == (TypeClass *)0x0) {
                  local_cc = 0;
                }
                else {
                  local_cc = (pTVar8->baseClass->super_TypeStruct).super_TypeBase.typeIndex;
                }
                Print(ctx,"__nullcTR[%d], ",(ulong)local_cc);
                Print(ctx,"%d, NULLC_CLASS, %d, ",(ulong)curr._4_4_,
                      (ulong)(pTVar8->super_TypeStruct).super_TypeBase.alignment);
                bVar11 = (pTVar8->hasFinalizer & 1U) != 0;
                if (bVar11) {
                  Print(ctx,"NULLC_TYPE_FLAG_HAS_FINALIZER");
                }
                if ((pTVar8->extendable & 1U) != 0) {
                  pcVar10 = "";
                  if (bVar11) {
                    pcVar10 = " | ";
                  }
                  Print(ctx,"%sNULLC_TYPE_FLAG_IS_EXTENDABLE",pcVar10);
                  bVar11 = true;
                }
                if ((pTVar8->completed & 1U) == 0) {
                  pcVar10 = "";
                  if (bVar11) {
                    pcVar10 = " | ";
                  }
                  Print(ctx,"%sNULLC_TYPE_FLAG_FORWARD_DECLARATION",pcVar10);
                  bVar11 = true;
                }
                if (!bVar11) {
                  Print(ctx,"0");
                }
                Print(ctx,");");
              }
            }
            else {
              Print(ctx,"__nullcTR[%d], ",(ulong)pTVar7->returnType->typeIndex);
              Print(ctx,"0, NULLC_FUNCTION, %d, 0);",(ulong)(pTVar7->super_TypeBase).alignment);
            }
          }
          else {
            Print(ctx,"__nullcTR[%d], ",(ulong)pTVar6->subType->typeIndex);
            Print(ctx,"1, NULLC_POINTER, %d, 0);",(ulong)(pTVar6->super_TypeBase).alignment);
          }
        }
        else {
          Print(ctx,"__nullcTR[%d], ",(ulong)pTVar5->subType->typeIndex);
          Print(ctx,"-1, NULLC_ARRAY, %d, 0);",
                (ulong)(pTVar5->super_TypeStruct).super_TypeBase.alignment);
        }
      }
      else {
        Print(ctx,"__nullcTR[%d], ",(ulong)pTVar4->subType->typeIndex);
        Print(ctx,"%d, NULLC_ARRAY, %d, 0);",pTVar4->length & 0xffffffff,
              (ulong)(pTVar4->super_TypeBase).alignment);
      }
      PrintLine(ctx);
    }
    else {
      PrintIndentedLine(ctx,"__nullcTR[%d] = 0; // generic type \'%.*s\'",(ulong)type._4_4_,
                        (ulong)(uint)((int)(pTVar1->name).end - (int)(pTVar1->name).begin),
                        (pTVar1->name).begin);
    }
  }
  PrintLine(ctx);
  PrintIndentedLine(ctx,"// Register type members");
  for (type_1._4_4_ = 0; uVar2 = SmallArray<TypeBase_*,_128U>::size(&ctx->ctx->types),
      type_1._4_4_ < uVar2; type_1._4_4_ = type_1._4_4_ + 1) {
    ppTVar3 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->ctx->types,type_1._4_4_);
    pTVar1 = *ppTVar3;
    if ((pTVar1->isGeneric & 1U) == 0) {
      pTVar7 = getType<TypeFunction>(pTVar1);
      if (pTVar7 == (TypeFunction *)0x0) {
        pTVar9 = getType<TypeStruct>(pTVar1);
        if (pTVar9 != (TypeStruct *)0x0) {
          curr_3._4_4_ = 0;
          for (curr_4 = (pTVar9->members).head; curr_4 != (MemberHandle *)0x0; curr_4 = curr_4->next
              ) {
            if (*(curr_4->variable->name->name).begin != '$') {
              curr_3._4_4_ = curr_3._4_4_ + 1;
            }
          }
          PrintIndent(ctx);
          Print(ctx,"__nullcRegisterMembers(__nullcTR[%d], %d",(ulong)type_1._4_4_,
                (ulong)curr_3._4_4_);
          for (local_b8 = (pTVar9->members).head; local_b8 != (MemberHandle *)0x0;
              local_b8 = local_b8->next) {
            if (*(local_b8->variable->name->name).begin != '$') {
              Print(ctx,", __nullcTR[%d]",(ulong)local_b8->variable->type->typeIndex);
              Print(ctx,", %d",(ulong)local_b8->variable->offset);
              Print(ctx,", \"%.*s\"",
                    (ulong)(uint)((int)(local_b8->variable->name->name).end -
                                 (int)(local_b8->variable->name->name).begin),
                    (local_b8->variable->name->name).begin);
            }
          }
          Print(ctx,"); // type \'%.*s\' members",
                (ulong)(uint)((int)(pTVar1->name).end - (int)(pTVar1->name).begin),
                (pTVar1->name).begin);
          PrintLine(ctx);
        }
      }
      else {
        PrintIndent(ctx);
        uVar2 = IntrusiveList<TypeHandle>::size(&pTVar7->arguments);
        Print(ctx,"__nullcRegisterMembers(__nullcTR[%d], %d",(ulong)type_1._4_4_,(ulong)uVar2);
        for (typeStruct_1 = (TypeStruct *)(pTVar7->arguments).head;
            typeStruct_1 != (TypeStruct *)0x0;
            typeStruct_1 = *(TypeStruct **)&(typeStruct_1->super_TypeBase).typeID) {
          Print(ctx,", __nullcTR[%d]",
                (ulong)*(uint *)((typeStruct_1->super_TypeBase)._vptr_TypeBase + 5));
          Print(ctx,", 0");
          Print(ctx,", \"\"");
        }
        Print(ctx,"); // type \'%.*s\' arguments",
              (ulong)(uint)((int)(pTVar1->name).end - (int)(pTVar1->name).begin),
              (pTVar1->name).begin);
        PrintLine(ctx);
      }
    }
  }
  PrintLine(ctx);
  return;
}

Assistant:

void TranslateModuleTypeInformation(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Register types");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
		{
			PrintIndentedLine(ctx, "__nullcTR[%d] = 0; // generic type '%.*s'", i, FMT_ISTR(type->name));
			continue;
		}

		PrintIndent(ctx);
		Print(ctx, "__nullcTR[%d] = __nullcRegisterType(", i);
		Print(ctx, "%uu, ", type->nameHash);
		Print(ctx, "\"%.*s\", ", FMT_ISTR(type->name));
		Print(ctx, "%lld, ", type->size);

		if(TypeArray *typeArray = getType<TypeArray>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeArray->subType->typeIndex);
			Print(ctx, "%d, NULLC_ARRAY, %d, 0);", (unsigned)typeArray->length, typeArray->alignment);
		}
		else if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeUnsizedArray->subType->typeIndex);
			Print(ctx, "-1, NULLC_ARRAY, %d, 0);", typeUnsizedArray->alignment);
		}
		else if(TypeRef *typeRef = getType<TypeRef>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeRef->subType->typeIndex);
			Print(ctx, "1, NULLC_POINTER, %d, 0);", typeRef->alignment);
		}
		else if(TypeFunction *typeFunction = getType<TypeFunction>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeFunction->returnType->typeIndex);
			Print(ctx, "0, NULLC_FUNCTION, %d, 0);", typeFunction->alignment);
		}
		else if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			Print(ctx, "__nullcTR[%d], ", typeClass->baseClass ? typeClass->baseClass->typeIndex : 0);
			Print(ctx, "%d, NULLC_CLASS, %d, ", count, typeClass->alignment);

			bool hasFlags = false;

			if(typeClass->hasFinalizer)
			{
				Print(ctx, "NULLC_TYPE_FLAG_HAS_FINALIZER");
				hasFlags = true;
			}

			if(typeClass->extendable)
			{
				Print(ctx, "%sNULLC_TYPE_FLAG_IS_EXTENDABLE", hasFlags ? " | " : "");
				hasFlags = true;
			}

			if(!typeClass->completed)
			{
				Print(ctx, "%sNULLC_TYPE_FLAG_FORWARD_DECLARATION", hasFlags ? " | " : "");
				hasFlags = true;
			}

			if(!hasFlags)
				Print(ctx, "0");

			Print(ctx, ");");
		}
		else if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			Print(ctx, "__nullcTR[0], ");
			Print(ctx, "%d, NULLC_CLASS, %d, 0);", count, typeStruct->alignment);
		}
		else
		{
			Print(ctx, "__nullcTR[0], ");
			Print(ctx, "0, NULLC_NONE, %d, 0);", type->alignment);
		}

		PrintLine(ctx);
	}

	PrintLine(ctx);

	PrintIndentedLine(ctx, "// Register type members");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
			continue;

		if(TypeFunction *typeFunction = getType<TypeFunction>(type))
		{
			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterMembers(__nullcTR[%d], %d", i, typeFunction->arguments.size());

			for(TypeHandle *curr = typeFunction->arguments.head; curr; curr = curr->next)
			{
				Print(ctx, ", __nullcTR[%d]", curr->type->typeIndex);
				Print(ctx, ", 0");
				Print(ctx, ", \"\"");
			}

			Print(ctx, "); // type '%.*s' arguments", FMT_ISTR(type->name));
			PrintLine(ctx);
		}
		else if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterMembers(__nullcTR[%d], %d", i, count);

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				Print(ctx, ", __nullcTR[%d]", curr->variable->type->typeIndex);
				Print(ctx, ", %d", curr->variable->offset);
				Print(ctx, ", \"%.*s\"", FMT_ISTR(curr->variable->name->name));
			}

			Print(ctx, "); // type '%.*s' members", FMT_ISTR(type->name));
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}